

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O3

QLinearGradient *
qt_fusion_gradient(QLinearGradient *__return_storage_ptr__,QRect *rect,QBrush *baseColor,
                  Direction direction)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  undefined8 *puVar9;
  QGradientStops *pQVar10;
  long in_FS_OFFSET;
  double dVar11;
  undefined1 auVar12 [16];
  QArrayData *local_90;
  QArrayDataPointer<std::pair<double,_QColor>_> local_88;
  QGradientData local_70;
  CoordinateMode local_40;
  InterpolationMode IStack_3c;
  QLinearGradient *local_38;
  
  local_38 = *(QLinearGradient **)(in_FS_OFFSET + 0x28);
  iVar1 = (rect->x1).m_i;
  iVar2 = (rect->x2).m_i;
  iVar3 = (rect->y1).m_i;
  iVar4 = (rect->y2).m_i;
  puVar9 = &DAT_006d01e0;
  pQVar10 = (QGradientStops *)__return_storage_ptr__;
  for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pQVar10->d).d = (Data *)*puVar9;
    puVar9 = puVar9 + 1;
    pQVar10 = &((QGradient *)&pQVar10->d)->m_stops;
  }
  QLinearGradient::QLinearGradient(__return_storage_ptr__);
  if (direction == FromLeft) {
    lVar8 = (long)iVar4 + (long)iVar3;
    dVar5 = (double)(rect->x1).m_i;
    dVar11 = (double)(int)((ulong)(lVar8 - (lVar8 >> 0x3f)) >> 1);
    dVar6 = dVar11;
    dVar7 = (double)(rect->x2).m_i;
  }
  else {
    lVar8 = (long)iVar2 + (long)iVar1;
    dVar5 = (double)(int)((ulong)(lVar8 - (lVar8 >> 0x3f)) >> 1);
    dVar6 = (double)(rect->y1).m_i;
    dVar11 = (double)(rect->y2).m_i;
    dVar7 = dVar5;
  }
  QLinearGradient::QLinearGradient((QLinearGradient *)&local_90,dVar5,dVar6,dVar7,dVar11);
  *(QArrayData **)&__return_storage_ptr__->super_QGradient = local_90;
  QArrayDataPointer<std::pair<double,_QColor>_>::operator=
            (&(__return_storage_ptr__->super_QGradient).m_stops.d,&local_88);
  (__return_storage_ptr__->super_QGradient).m_data.linear.x1 = local_70.linear.x1;
  (__return_storage_ptr__->super_QGradient).m_data.linear.y1 = local_70.linear.y1;
  (__return_storage_ptr__->super_QGradient).m_data.linear.x2 = local_70.linear.x2;
  (__return_storage_ptr__->super_QGradient).m_data.linear.y2 = local_70.linear.y2;
  (__return_storage_ptr__->super_QGradient).m_data.radial.cradius = local_70.radial.cradius;
  (__return_storage_ptr__->super_QGradient).m_data.radial.fradius = local_70.radial.fradius;
  (__return_storage_ptr__->super_QGradient).m_coordinateMode = local_40;
  (__return_storage_ptr__->super_QGradient).m_interpolationMode = IStack_3c;
  QLinearGradient::~QLinearGradient((QLinearGradient *)&local_90);
  lVar8 = QBrush::gradient();
  if (lVar8 == 0) {
    local_88.d._4_4_ = 0xaaaaaaaa;
    auVar12 = QColor::lighter((int)*(undefined8 *)baseColor + 8);
    local_90 = auVar12._0_8_;
    local_88.d._0_4_ = auVar12._8_4_;
    local_88.d._4_4_ = CONCAT22(local_88.d._6_2_,auVar12._12_2_);
    QColor::lighter((int)*(undefined8 *)baseColor + 8);
    QGradient::setColorAt(0.0,(QColor *)__return_storage_ptr__);
    QGradient::setColorAt(1.0,(QColor *)__return_storage_ptr__);
  }
  else {
    QBrush::gradient();
    QGradient::stops();
    QGradient::setStops((QList_conflict *)__return_storage_ptr__);
    if (local_90 != (QArrayData *)0x0) {
      LOCK();
      (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_90,0x18,0x10);
      }
    }
  }
  if (*(QLinearGradient **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(QLinearGradient **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QLinearGradient qt_fusion_gradient(const QRect &rect, const QBrush &baseColor, Direction direction = TopDown)
{
    int x = rect.center().x();
    int y = rect.center().y();
    QLinearGradient gradient;
    switch (direction) {
    case FromLeft:
        gradient = QLinearGradient(rect.left(), y, rect.right(), y);
        break;
    case FromRight:
        gradient = QLinearGradient(rect.right(), y, rect.left(), y);
        break;
    case BottomUp:
        gradient = QLinearGradient(x, rect.bottom(), x, rect.top());
        break;
    case TopDown:
    default:
        gradient = QLinearGradient(x, rect.top(), x, rect.bottom());
        break;
    }
    if (baseColor.gradient())
        gradient.setStops(baseColor.gradient()->stops());
    else {
        QColor gradientStartColor = baseColor.color().lighter(124);
        QColor gradientStopColor = baseColor.color().lighter(102);
        gradient.setColorAt(0, gradientStartColor);
        gradient.setColorAt(1, gradientStopColor);
        //          Uncomment for adding shiny shading
        //            QColor midColor1 = mergedColors(gradientStartColor, gradientStopColor, 55);
        //            QColor midColor2 = mergedColors(gradientStartColor, gradientStopColor, 45);
        //            gradient.setColorAt(0.5, midColor1);
        //            gradient.setColorAt(0.501, midColor2);
    }
    return gradient;
}